

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O3

void av1_copy_tree_context(PICK_MODE_CONTEXT *dst_ctx,PICK_MODE_CONTEXT *src_ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int iVar6;
  undefined7 uVar7;
  long lVar8;
  MB_MODE_INFO_EXT_FRAME *pMVar9;
  MB_MODE_INFO_EXT_FRAME *pMVar10;
  byte bVar11;
  
  bVar11 = 0;
  memcpy(dst_ctx,src_ctx,0xb0);
  pMVar9 = &src_ctx->mbmi_ext_best;
  pMVar10 = &dst_ctx->mbmi_ext_best;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    pMVar10->ref_mv_stack[0] = pMVar9->ref_mv_stack[0];
    pMVar9 = (MB_MODE_INFO_EXT_FRAME *)((long)pMVar9 + (ulong)bVar11 * -0x10 + 8);
    pMVar10 = (MB_MODE_INFO_EXT_FRAME *)((long)pMVar10 + (ulong)bVar11 * -0x10 + 8);
  }
  *(undefined4 *)((dst_ctx->mbmi_ext_best).cb_offset + 1) =
       *(undefined4 *)((src_ctx->mbmi_ext_best).cb_offset + 1);
  uVar1 = src_ctx->num_4x4_blk;
  uVar2 = src_ctx->skippable;
  dst_ctx->num_4x4_blk = uVar1;
  dst_ctx->skippable = uVar2;
  memcpy(dst_ctx->blk_skip,src_ctx->blk_skip,(long)(int)uVar1);
  memcpy(dst_ctx->tx_type_map,src_ctx->tx_type_map,(long)src_ctx->num_4x4_blk);
  iVar6 = (src_ctx->rd_stats).zero_rate;
  iVar3 = (src_ctx->rd_stats).dist;
  iVar4 = (src_ctx->rd_stats).rdcost;
  iVar5 = (src_ctx->rd_stats).sse;
  (dst_ctx->rd_stats).rate = (src_ctx->rd_stats).rate;
  (dst_ctx->rd_stats).zero_rate = iVar6;
  (dst_ctx->rd_stats).dist = iVar3;
  (dst_ctx->rd_stats).rdcost = iVar4;
  (dst_ctx->rd_stats).sse = iVar5;
  uVar7 = *(undefined7 *)&(src_ctx->rd_stats).field_0x21;
  (dst_ctx->rd_stats).skip_txfm = (src_ctx->rd_stats).skip_txfm;
  *(undefined7 *)&(dst_ctx->rd_stats).field_0x21 = uVar7;
  dst_ctx->rd_mode_is_ready = src_ctx->rd_mode_is_ready;
  return;
}

Assistant:

void av1_copy_tree_context(PICK_MODE_CONTEXT *dst_ctx,
                           PICK_MODE_CONTEXT *src_ctx) {
  dst_ctx->mic = src_ctx->mic;
  dst_ctx->mbmi_ext_best = src_ctx->mbmi_ext_best;

  dst_ctx->num_4x4_blk = src_ctx->num_4x4_blk;
  dst_ctx->skippable = src_ctx->skippable;
#if CONFIG_INTERNAL_STATS
  dst_ctx->best_mode_index = src_ctx->best_mode_index;
#endif  // CONFIG_INTERNAL_STATS

  memcpy(dst_ctx->blk_skip, src_ctx->blk_skip,
         sizeof(uint8_t) * src_ctx->num_4x4_blk);
  av1_copy_array(dst_ctx->tx_type_map, src_ctx->tx_type_map,
                 src_ctx->num_4x4_blk);

  dst_ctx->rd_stats = src_ctx->rd_stats;
  dst_ctx->rd_mode_is_ready = src_ctx->rd_mode_is_ready;
}